

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<Fad<double>_>::AddKel
          (TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *elmat,
          TPZVec<long> *destinationindex)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  Fad<double> *pFVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  Fad<double> prevval;
  Fad<double> local_68;
  long local_48;
  long local_40;
  long local_38;
  
  lVar12 = (elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  local_40 = lVar12;
  if (iVar5 == 0) {
    if (0 < lVar12) {
      lVar12 = 0;
      do {
        lVar2 = destinationindex->fStore[lVar12];
        lVar13 = 0;
        local_48 = lVar12;
        do {
          lVar4 = local_48;
          lVar7 = destinationindex->fStore[lVar13];
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_68,this,lVar2);
          lVar9 = (elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
          if ((lVar9 <= lVar4) ||
             ((elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= lVar13)) {
            TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar9 = lVar9 * lVar13;
          uVar1 = elmat->fElem[lVar9 + lVar12].dx_.num_elts;
          uVar6 = (ulong)uVar1;
          pFVar10 = elmat->fElem + lVar9 + lVar12;
          if (uVar6 != 0) {
            pdVar8 = (pFVar10->dx_).ptr_to_data;
            if ((ulong)(uint)local_68.dx_.num_elts == 0) {
              uVar11 = uVar6 * 8;
              if ((int)uVar1 < 0) {
                uVar11 = 0xffffffffffffffff;
              }
              local_68.dx_.num_elts = uVar1;
              local_68.dx_.ptr_to_data = (double *)operator_new__(uVar11);
              if (0 < (int)uVar1) {
                uVar11 = 0;
                do {
                  local_68.dx_.ptr_to_data[uVar11] = pdVar8[uVar11];
                  uVar11 = uVar11 + 1;
                } while (uVar6 != uVar11);
              }
            }
            else if (0 < local_68.dx_.num_elts) {
              uVar6 = 0;
              do {
                local_68.dx_.ptr_to_data[uVar6] = pdVar8[uVar6] + local_68.dx_.ptr_to_data[uVar6];
                uVar6 = uVar6 + 1;
              } while ((uint)local_68.dx_.num_elts != uVar6);
            }
          }
          local_68.val_ = pFVar10->val_ + local_68.val_;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar2,lVar7,&local_68);
          Fad<double>::~Fad(&local_68);
          lVar13 = lVar13 + 1;
        } while (lVar13 != local_40);
        lVar12 = local_48 + 1;
      } while (lVar12 != local_40);
    }
  }
  else if (0 < lVar12) {
    lVar12 = 0;
    do {
      lVar2 = destinationindex->fStore[lVar12];
      local_48 = lVar12 << 5;
      local_38 = lVar12;
      do {
        lVar9 = local_38;
        lVar13 = destinationindex->fStore[lVar12];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&local_68,this,lVar2)
        ;
        lVar7 = (elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
        if ((lVar7 <= lVar9) ||
           ((elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= lVar12)) {
          TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar7 = lVar7 * lVar12;
        uVar1 = *(uint *)((long)&elmat->fElem[lVar7].dx_.num_elts + local_48);
        uVar6 = (ulong)uVar1;
        pdVar8 = (double *)((long)&elmat->fElem[lVar7].val_ + local_48);
        if (uVar6 != 0) {
          dVar3 = pdVar8[2];
          if ((ulong)(uint)local_68.dx_.num_elts == 0) {
            uVar11 = uVar6 * 8;
            if ((int)uVar1 < 0) {
              uVar11 = 0xffffffffffffffff;
            }
            local_68.dx_.num_elts = uVar1;
            local_68.dx_.ptr_to_data = (double *)operator_new__(uVar11);
            if (0 < (int)uVar1) {
              uVar11 = 0;
              do {
                local_68.dx_.ptr_to_data[uVar11] = *(double *)((long)dVar3 + uVar11 * 8);
                uVar11 = uVar11 + 1;
              } while (uVar6 != uVar11);
            }
          }
          else if (0 < local_68.dx_.num_elts) {
            uVar6 = 0;
            do {
              local_68.dx_.ptr_to_data[uVar6] =
                   *(double *)((long)dVar3 + uVar6 * 8) + local_68.dx_.ptr_to_data[uVar6];
              uVar6 = uVar6 + 1;
            } while ((uint)local_68.dx_.num_elts != uVar6);
          }
        }
        local_68.val_ = *pdVar8 + local_68.val_;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar13,&local_68);
        Fad<double>::~Fad(&local_68);
        lVar12 = lVar12 + 1;
      } while (lVar12 < local_40);
      lVar12 = local_38 + 1;
    } while (lVar12 != local_40);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = elmat.Rows();
  	int64_t icoef,jcoef,ieq,jeq;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}